

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManUnivTfo_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes,Vec_Int_t *vPos)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] == p->nTravIds) {
    return 0;
  }
  p->pTravIds[iObj] = p->nTravIds;
  if (vNodes != (Vec_Int_t *)0x0) {
    if ((iObj < 0) || (p->nObjs <= iObj)) goto LAB_007a1788;
    if ((~*(uint *)(p->pObjs + (uint)iObj) & 0x1fffffff) != 0 &&
        (int)*(uint *)(p->pObjs + (uint)iObj) < 0) {
      Vec_IntPush(vNodes,iObj);
    }
  }
  if (vPos == (Vec_Int_t *)0x0) {
    if (iObj < 0) goto LAB_007a1769;
  }
  else {
    if ((iObj < 0) || (p->nObjs <= iObj)) {
LAB_007a1788:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if ((~*(uint *)(p->pObjs + (uint)iObj) & 0x1fffffff) != 0 &&
        (int)*(uint *)(p->pObjs + (uint)iObj) < 0) {
      Vec_IntPush(vPos,iObj);
    }
  }
  pVVar4 = p->vFanoutNums;
  if (iObj < pVVar4->nSize) {
    iVar7 = 1;
    iVar6 = 0;
    while( true ) {
      if (pVVar4->pArray[(uint)iObj] <= iVar6) {
        return iVar7;
      }
      uVar1 = p->vFanout->nSize;
      if ((int)uVar1 <= iObj) break;
      piVar2 = p->vFanout->pArray;
      uVar5 = piVar2[(uint)iObj] + iVar6;
      if (((int)uVar5 < 0) || (uVar1 <= uVar5)) break;
      iVar3 = Gia_ManUnivTfo_rec(p,piVar2[uVar5],vNodes,vPos);
      iVar7 = iVar7 + iVar3;
      iVar6 = iVar6 + 1;
      pVVar4 = p->vFanoutNums;
      if (pVVar4->nSize <= iObj) break;
    }
  }
LAB_007a1769:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManUnivTfo_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes, Vec_Int_t * vPos )
{
    int i, iFan, Count = 1;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    if ( vNodes && Gia_ObjIsCo(Gia_ManObj(p, iObj)) )
        Vec_IntPush( vNodes, iObj );    
    if ( vPos && Gia_ObjIsCo(Gia_ManObj(p, iObj)) )
        Vec_IntPush( vPos, iObj );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        Count += Gia_ManUnivTfo_rec( p, iFan, vNodes, vPos );
    return Count;
}